

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O3

bool __thiscall
ELFIO::segment_impl<ELFIO::Elf64_Phdr>::load
          (segment_impl<ELFIO::Elf64_Phdr> *this,istream *stream,streampos header_offset,
          bool is_lazy_)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  __mbstate_t _Var5;
  pointer paVar6;
  pointer paVar7;
  
  _Var5 = header_offset._M_state;
  lVar4 = header_offset._M_off;
  this->pstream = stream;
  this->is_lazy = is_lazy_;
  paVar6 = (this->translator->addr_translations).
           super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar7 = (this->translator->addr_translations).
           super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar2 = 0xffffffffffffffff;
  if (paVar6 == paVar7) {
    std::istream::seekg((long)stream,_S_beg);
    sVar2 = std::istream::tellg();
    paVar6 = (this->translator->addr_translations).
             super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar7 = (this->translator->addr_translations).
             super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  this->stream_size = sVar2;
  do {
    if (paVar6 == paVar7) {
LAB_0010804a:
      std::istream::seekg(stream,lVar4,_Var5);
      std::istream::read((char *)stream,(long)&this->ph);
      this->is_offset_set = true;
      if ((this->is_lazy == false) && (this->is_loaded == false)) {
        bVar1 = load_data(this);
        return bVar1;
      }
      return true;
    }
    lVar3 = lVar4 - *(long *)paVar6;
    if ((*(long *)paVar6 <= lVar4) && (lVar3 < *(long *)(paVar6 + 0x10))) {
      lVar4 = lVar3 + *(long *)(paVar6 + 0x20);
      _Var5.__count = 0;
      _Var5.__value = (anon_union_4_2_91654ee9_for___value)0x0;
      goto LAB_0010804a;
    }
    paVar6 = paVar6 + 0x30;
  } while( true );
}

Assistant:

bool load( std::istream&  stream,
               std::streampos header_offset,
               bool           is_lazy_ ) override
    {
        pstream = &stream;
        is_lazy = is_lazy_;

        if ( translator->empty() ) {
            stream.seekg( 0, std::istream::end );
            set_stream_size( size_t( stream.tellg() ) );
        }
        else {
            set_stream_size( std::numeric_limits<size_t>::max() );
        }

        stream.seekg( ( *translator )[header_offset] );
        stream.read( reinterpret_cast<char*>( &ph ), sizeof( ph ) );

        is_offset_set = true;

        if ( !( is_lazy || is_loaded ) ) {
            return load_data();
        }

        return true;
    }